

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extra_operator_info.hpp
# Opt level: O1

void __thiscall
duckdb::ExtraOperatorInfo::ExtraOperatorInfo(ExtraOperatorInfo *this,ExtraOperatorInfo *extra_info)

{
  pointer pcVar1;
  idx_t iVar2;
  optional_idx local_20;
  
  (this->file_filters)._M_dataplus._M_p = (pointer)&(this->file_filters).field_2;
  pcVar1 = (extra_info->file_filters)._M_dataplus._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)this,pcVar1,pcVar1 + (extra_info->file_filters)._M_string_length);
  *(undefined4 *)&(this->total_files).index = 0xffffffff;
  *(undefined4 *)((long)&(this->total_files).index + 4) = 0xffffffff;
  *(undefined4 *)&(this->filtered_files).index = 0xffffffff;
  *(undefined4 *)((long)&(this->filtered_files).index + 4) = 0xffffffff;
  (this->sample_options).
  super_unique_ptr<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>_>._M_t.
  super___uniq_ptr_impl<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::SampleOptions_*,_std::default_delete<duckdb::SampleOptions>_>.
  super__Head_base<0UL,_duckdb::SampleOptions_*,_false>._M_head_impl =
       (extra_info->sample_options).
       super_unique_ptr<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>_>._M_t.
       super___uniq_ptr_impl<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>_>.
       _M_t.
       super__Tuple_impl<0UL,_duckdb::SampleOptions_*,_std::default_delete<duckdb::SampleOptions>_>.
       super__Head_base<0UL,_duckdb::SampleOptions_*,_false>._M_head_impl;
  (extra_info->sample_options).
  super_unique_ptr<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>_>._M_t.
  super___uniq_ptr_impl<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::SampleOptions_*,_std::default_delete<duckdb::SampleOptions>_>.
  super__Head_base<0UL,_duckdb::SampleOptions_*,_false>._M_head_impl = (SampleOptions *)0x0;
  if ((extra_info->total_files).index != 0xffffffffffffffff) {
    iVar2 = optional_idx::GetIndex(&extra_info->total_files);
    optional_idx::optional_idx(&local_20,iVar2);
    (this->total_files).index = local_20.index;
  }
  if ((extra_info->filtered_files).index != 0xffffffffffffffff) {
    iVar2 = optional_idx::GetIndex(&extra_info->filtered_files);
    optional_idx::optional_idx(&local_20,iVar2);
    (this->filtered_files).index = local_20.index;
  }
  return;
}

Assistant:

ExtraOperatorInfo(ExtraOperatorInfo &extra_info)
	    : file_filters(extra_info.file_filters), sample_options(std::move(extra_info.sample_options)) {
		if (extra_info.total_files.IsValid()) {
			total_files = extra_info.total_files.GetIndex();
		}
		if (extra_info.filtered_files.IsValid()) {
			filtered_files = extra_info.filtered_files.GetIndex();
		}
	}